

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::validateICC(LodePNGICC *icc)

{
  uint uVar1;
  
  uVar1 = icc->inputspace;
  if (uVar1 != 0) {
    if (((uVar1 == 2) && (icc->has_chromaticity == 0)) || (icc->has_whitepoint == 0)) {
      return 0;
    }
    uVar1 = (uint)(icc->has_trc != 0);
  }
  return uVar1;
}

Assistant:

static unsigned validateICC(const LodePNGICC* icc) {
  /* disable for unsupported things in the icc profile */
  if(icc->inputspace == 0) return 0;
  /* if we didn't recognize both chrm and trc, then maybe the ICC uses data
  types not supported here yet, so fall back to not using it. */
  if(icc->inputspace == 2) {
    /* RGB profile should have chromaticities */
    if(!icc->has_chromaticity) return 0;
  }
  /* An ICC profile without whitepoint is invalid for the kind of profiles used here. */
  if(!icc->has_whitepoint) return 0;
  if(!icc->has_trc) return 0;
  return 1; /* ok */
}